

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IffEventClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IffEventClauseSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Token iff;
  IffEventClauseSyntax *this_00;
  
  this_00 = (IffEventClauseSyntax *)allocate(this,0x28,8);
  iff.kind = args->kind;
  iff._2_1_ = args->field_0x2;
  iff.numFlags.raw = (args->numFlags).raw;
  iff.rawLen = args->rawLen;
  iff.info = args->info;
  slang::syntax::IffEventClauseSyntax::IffEventClauseSyntax(this_00,iff,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }